

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O2

void __thiscall test_CEObservation::test_CEObservation(test_CEObservation *this)

{
  CEBody *this_00;
  CEDate *this_01;
  CEObserver *this_02;
  double dVar1;
  allocator local_139;
  CEAngle local_138;
  CEAngle local_128;
  undefined8 local_118;
  CESkyCoordType local_10c;
  string local_108;
  double local_e8;
  CEObserver local_e0;
  
  CETestSuite::CETestSuite(&this->super_CETestSuite);
  *(undefined ***)this = &PTR__test_CEObservation_00141590;
  this_00 = &this->base_body_;
  CEBody::CEBody(this_00);
  dVar1 = CEDate::CurrentJD();
  this_01 = &this->base_date_;
  CEDate::CEDate(this_01,dVar1,JD);
  this_02 = &this->base_observer_;
  CEObserver::CEObserver(this_02);
  CEObservation::CEObservation(&this->base_obs_);
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_128._vptr_CEAngle = (_func_int **)0x0;
  local_138._vptr_CEAngle = (_func_int **)0x0;
  local_118 = (double)((ulong)local_118._4_4_ << 0x20);
  CEObserver::CEObserver
            (&local_e0,(double *)&local_108,(double *)&local_128,(double *)&local_138,
             (CEAngleType *)&local_118);
  CEObserver::operator=(this_02,&local_e0);
  CEObserver::~CEObserver(&local_e0);
  local_e0._vptr_CEObserver = (_func_int **)0x0;
  CEObserver::SetTemperature_C(this_02,(double *)&local_e0);
  local_e0._vptr_CEObserver = (_func_int **)0x0;
  CEObserver::SetPressure_hPa(this_02,(double *)&local_e0);
  local_e0._vptr_CEObserver = (_func_int **)0x0;
  CEObserver::SetRelativeHumidity(this_02,(double *)&local_e0);
  local_e0._vptr_CEObserver = (_func_int **)0x0;
  CEObserver::SetWavelength_um(this_02,(double *)&local_e0);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate((CEDate *)&local_e0,dVar1,JD);
  CEDate::operator=(this_01,(CEDate *)&local_e0);
  CEDate::~CEDate((CEDate *)&local_e0);
  CEDate::SetReturnType(this_01,JD);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"test",&local_139);
  local_118 = 83.663;
  CEAngle::Deg(&local_128,(double *)&local_118);
  local_e8 = 22.0145;
  CEAngle::Deg(&local_138,&local_e8);
  local_10c = ICRS;
  CEBody::CEBody((CEBody *)&local_e0,&local_108,&local_128,&local_138,&local_10c);
  CEBody::operator=(this_00,(CEBody *)&local_e0);
  CEBody::~CEBody((CEBody *)&local_e0);
  CEAngle::~CEAngle(&local_138);
  CEAngle::~CEAngle(&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_139);
  CEObservation::CEObservation((CEObservation *)&local_e0,this_02,this_00,this_01);
  CEObservation::operator=(&this->base_obs_,(CEObservation *)&local_e0);
  CEObservation::~CEObservation((CEObservation *)&local_e0);
  return;
}

Assistant:

test_CEObservation::test_CEObservation() :
    CETestSuite()
{
    // Setup the observer
    base_observer_ = CEObserver(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    base_observer_.SetTemperature_C(0.0);
    base_observer_.SetPressure_hPa(0.0);
    base_observer_.SetRelativeHumidity(0.0);
    base_observer_.SetWavelength_um(0.0);

    // Setup the date
    base_date_ = CEDate(CppEphem::julian_date_J2000(), CEDateType::JD);
    base_date_.SetReturnType(CEDateType::JD);

    // Set the object that will be observed
    base_body_ = CEBody("test", CEAngle::Deg(83.663), CEAngle::Deg(22.0145), 
                        CESkyCoordType::ICRS);
    
    // Put it all together
    base_obs_ = CEObservation(&base_observer_, &base_body_, &base_date_);
}